

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareUnknownFields
          (MessageDifferencer *this,Message *message1,Message *message2,
          UnknownFieldSet *unknown_field_set1,UnknownFieldSet *unknown_field_set2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_field)

{
  pointer *ppSVar1;
  uint32 uVar2;
  pointer pUVar3;
  UnknownField *pUVar4;
  iterator iVar5;
  undefined1 auVar6 [8];
  pointer ppVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  undefined1 uVar10;
  int iVar11;
  int iVar12;
  pointer pUVar13;
  ulong uVar14;
  uint32 uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  UnknownField *pUVar24;
  ulong uVar25;
  bool bVar26;
  UnknownField *local_e8;
  undefined1 auStack_c8 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields1;
  undefined1 auStack_a8 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields2;
  undefined1 auStack_80 [8];
  _TmpBuf __buf;
  int local_58;
  int iStack_54;
  
  if (this->message_field_comparison_ != EQUIVALENT) {
    pUVar13 = (unknown_field_set1->fields_).
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pUVar3 = (unknown_field_set1->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pUVar13 != pUVar3) ||
       ((unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      auStack_c8 = (undefined1  [8])0x0;
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_c8,(long)(int)((ulong)((long)pUVar3 - (long)pUVar13) >> 4));
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_a8,
                (long)(int)((ulong)((long)(unknown_field_set2->fields_).
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(unknown_field_set2->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
      pUVar13 = (unknown_field_set1->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(unknown_field_set1->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) >> 4))
      {
        lVar19 = 0;
        lVar23 = 0;
        do {
          __buf._M_original_len = (long)&pUVar13->number_ + lVar19;
          auStack_80._0_4_ = (int)lVar23;
          if (fields1.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              fields1.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
            ::_M_realloc_insert<std::pair<int,google::protobuf::UnknownField_const*>>
                      ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                        *)auStack_c8,
                       (iterator)
                       fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<int,_const_google::protobuf::UnknownField_*> *)auStack_80);
          }
          else {
            (fields1.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = (int)lVar23;
            *(undefined4 *)
             &(fields1.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_80._4_4_;
            (fields1.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second =
                 (UnknownField *)__buf._M_original_len;
            fields1.
            super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 fields1.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar23 = lVar23 + 1;
          pUVar13 = (unknown_field_set1->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x10;
        } while (lVar23 < (int)((ulong)((long)(unknown_field_set1->fields_).
                                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pUVar13) >> 4));
      }
      pUVar13 = (unknown_field_set2->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(unknown_field_set2->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) >> 4))
      {
        lVar19 = 0;
        lVar23 = 0;
        do {
          __buf._M_original_len = (long)&pUVar13->number_ + lVar19;
          auStack_80._0_4_ = (int)lVar23;
          if (fields2.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              fields2.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
            ::_M_realloc_insert<std::pair<int,google::protobuf::UnknownField_const*>>
                      ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                        *)auStack_a8,
                       (iterator)
                       fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<int,_const_google::protobuf::UnknownField_*> *)auStack_80);
          }
          else {
            (fields2.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = (int)lVar23;
            *(undefined4 *)
             &(fields2.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_80._4_4_;
            (fields2.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second =
                 (UnknownField *)__buf._M_original_len;
            fields2.
            super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 fields2.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar23 = lVar23 + 1;
          pUVar13 = (unknown_field_set2->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = lVar19 + 0x10;
        } while (lVar23 < (int)((ulong)((long)(unknown_field_set2->fields_).
                                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pUVar13) >> 4));
      }
      ppVar7 = fields1.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar6 = auStack_c8;
      if (auStack_c8 !=
          (undefined1  [8])
          fields1.
          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar19 = (long)fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 4;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
                             *)auStack_80,
                            (__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>
                             )auStack_c8,(lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
        if (CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len) == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar6,ppVar7);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,std::pair<int,google::protobuf::UnknownField_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar6,ppVar7,CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len),
                     __buf._M_original_len);
        }
        operator_delete((void *)CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len));
      }
      ppVar7 = fields2.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar6 = auStack_a8;
      if (auStack_a8 !=
          (undefined1  [8])
          fields2.
          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar19 = (long)fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 4;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
                             *)auStack_80,
                            (__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>
                             )auStack_a8,(lVar19 - (lVar19 + 1 >> 0x3f)) + 1 >> 1);
        if (CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len) == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar6,ppVar7);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,std::pair<int,google::protobuf::UnknownField_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar6,ppVar7,CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len),
                     __buf._M_original_len);
        }
        operator_delete((void *)CONCAT44(__buf._M_len._4_4_,(int)__buf._M_len));
      }
      local_e8 = (UnknownField *)0x0;
      iVar20 = 0;
      iVar21 = 0;
      iVar12 = 0;
      iVar17 = 0;
LAB_0032555c:
      do {
        auVar8 = auStack_a8;
        auVar6 = auStack_c8;
        uVar25 = (ulong)iVar12;
        uVar14 = (long)fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 4;
        uVar16 = (long)fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 4;
        uVar22 = (ulong)iVar17;
        if (uVar25 < uVar14) {
          if (uVar16 != uVar22) {
            uVar15 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                     ((long)auStack_a8 + uVar22 * 0x10))->second->number_;
            uVar2 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_c8 + uVar25 * 0x10))->second->number_;
            if (((int)uVar15 <= (int)uVar2) &&
               (((int)uVar15 < (int)uVar2 ||
                ((int)((pair<int,_const_google::protobuf::UnknownField_*> *)
                      ((long)auStack_a8 + uVar22 * 0x10))->second->type_ <=
                 (int)((pair<int,_const_google::protobuf::UnknownField_*> *)
                      ((long)auStack_c8 + uVar25 * 0x10))->second->type_)))) goto LAB_003255d9;
          }
          pUVar24 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_c8 + uVar25 * 0x10))->second;
          uVar14 = 1;
          goto LAB_0032571b;
        }
        if (uVar16 <= uVar22) {
          bVar9 = true;
          goto LAB_00325a2f;
        }
LAB_003255d9:
        if (uVar14 != uVar25) {
          pUVar4 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                   ((long)auStack_a8 + uVar22 * 0x10))->second;
          pUVar24 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_c8 + uVar25 * 0x10))->second;
          if ((int)pUVar4->number_ < (int)pUVar24->number_) goto LAB_003255fe;
          if ((int)pUVar24->number_ < (int)pUVar4->number_) {
            uVar15 = pUVar24->type_;
          }
          else {
            uVar15 = pUVar24->type_;
            if ((int)pUVar4->type_ < (int)uVar15) goto LAB_003255fe;
          }
          uVar14 = 2;
          bVar9 = true;
          switch(uVar15) {
          case 0:
            if (pUVar4->type_ != 0) {
              __assert_fail("type() == TYPE_VARINT",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/unknown_field_set.h"
                            ,0x15a,"uint64 google::protobuf::UnknownField::varint() const");
            }
            break;
          case 1:
            if (pUVar4->type_ != 1) {
              __assert_fail("type() == TYPE_FIXED32",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/unknown_field_set.h"
                            ,0x15e,"uint32 google::protobuf::UnknownField::fixed32() const");
            }
            bVar26 = (pUVar24->data_).fixed32_ == (pUVar4->data_).fixed32_;
            goto LAB_00325707;
          case 2:
            if (pUVar4->type_ != 2) {
              __assert_fail("type() == TYPE_FIXED64",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/unknown_field_set.h"
                            ,0x162,"uint64 google::protobuf::UnknownField::fixed64() const");
            }
            break;
          case 3:
            if (pUVar4->type_ != 3) {
              __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/unknown_field_set.h"
                            ,0x166,
                            "const std::string &google::protobuf::UnknownField::length_delimited() const"
                           );
            }
            pUVar13 = (((pUVar24->data_).group_)->fields_).
                      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pUVar13 !=
                (((pUVar4->data_).group_)->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto switchD_0032566f_default;
            bVar9 = true;
            if (pUVar13 != (pointer)0x0) {
              iVar11 = bcmp((((pUVar24->data_).group_)->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (((pUVar4->data_).group_)->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_start,(size_t)pUVar13);
              bVar26 = iVar11 == 0;
              goto LAB_00325707;
            }
            bVar26 = true;
            goto LAB_0032570a;
          case 4:
            uVar14 = 3;
            bVar9 = false;
          default:
switchD_0032566f_default:
            bVar26 = false;
            goto LAB_0032570a;
          }
          bVar26 = (pUVar24->data_).varint_ == (pUVar4->data_).varint_;
LAB_00325707:
          bVar9 = true;
LAB_0032570a:
          uVar18 = 4;
          if (!bVar26) {
            uVar18 = (uint)uVar14;
          }
          if (bVar9) {
            uVar14 = (ulong)uVar18;
          }
LAB_0032571b:
          ppVar7 = fields2.
                   super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (((local_e8 == (UnknownField *)0x0) || (pUVar24->number_ != local_e8->number_)) ||
             (pUVar24->type_ != local_e8->type_)) {
            local_e8 = pUVar24;
            iVar20 = iVar12;
            iVar21 = iVar17;
          }
          uVar18 = (uint)uVar14;
          if ((uVar18 != 4) ||
             (*(long *)fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage != 0)) {
            auStack_80 = (undefined1  [8])0x0;
            __buf._M_original_len._0_4_ = pUVar24->number_;
            __buf._M_original_len._4_4_ = pUVar24->type_;
            if (uVar18 == 0) {
              iStack_54 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                          ((long)auVar8 + uVar22 * 0x10))->first;
              local_58 = -1;
              __buf._M_len._4_4_ = iVar17 - iVar21;
              __buf._M_len._0_4_ = __buf._M_len._4_4_;
            }
            else {
              iStack_54 = -1;
              local_58 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                         ((long)auVar6 + uVar25 * 0x10))->first;
              if (uVar18 != 1) {
                iStack_54 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                            ((long)auVar8 + uVar22 * 0x10))->first;
              }
              __buf._M_len._4_4_ = iVar17 - iVar21;
              __buf._M_len._0_4_ = iVar12 - iVar20;
            }
            __buf._M_buffer = (pointer)unknown_field_set1;
            bVar9 = IsUnknownFieldIgnored
                              ((MessageDifferencer *)
                               fields2.
                               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,message1,message2,
                               (SpecificField *)auStack_80,parent_field);
            if (bVar9) {
              if (*(long *)ppVar7 != 0) {
                iVar5._M_current =
                     (parent_field->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (parent_field->
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                  ::
                  _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                            ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                              *)parent_field,iVar5,(SpecificField *)auStack_80);
                }
                else {
                  (iVar5._M_current)->unknown_field_set2 = unknown_field_set2;
                  (iVar5._M_current)->unknown_field_index1 = local_58;
                  (iVar5._M_current)->unknown_field_index2 = iStack_54;
                  (iVar5._M_current)->index = (int)__buf._M_len;
                  (iVar5._M_current)->new_index = __buf._M_len._4_4_;
                  (iVar5._M_current)->unknown_field_set1 = (UnknownFieldSet *)__buf._M_buffer;
                  *(undefined4 *)&(iVar5._M_current)->field = auStack_80._0_4_;
                  *(undefined4 *)((long)&(iVar5._M_current)->field + 4) = auStack_80._4_4_;
                  (iVar5._M_current)->unknown_field_number = (int)__buf._M_original_len;
                  (iVar5._M_current)->unknown_field_type = __buf._M_original_len._4_4_;
                  ppSVar1 = &(parent_field->
                             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppSVar1 = *ppSVar1 + 1;
                }
                (**(code **)(**(long **)ppVar7 + 0x40))
                          (*(long **)ppVar7,message1,message2,parent_field);
                ppSVar1 = &(parent_field->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
              }
            }
            else if ((2 < uVar18) || (*(long *)ppVar7 != 0)) {
              iVar5._M_current =
                   (parent_field->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar5._M_current !=
                  (parent_field->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                (iVar5._M_current)->unknown_field_set2 = unknown_field_set2;
                (iVar5._M_current)->unknown_field_index1 = local_58;
                (iVar5._M_current)->unknown_field_index2 = iStack_54;
                (iVar5._M_current)->index = (int)__buf._M_len;
                (iVar5._M_current)->new_index = __buf._M_len._4_4_;
                *(undefined4 *)&(iVar5._M_current)->unknown_field_set1 = __buf._M_buffer._0_4_;
                *(undefined4 *)((long)&(iVar5._M_current)->unknown_field_set1 + 4) =
                     __buf._M_buffer._4_4_;
                *(undefined4 *)&(iVar5._M_current)->field = auStack_80._0_4_;
                *(undefined4 *)((long)&(iVar5._M_current)->field + 4) = auStack_80._4_4_;
                (iVar5._M_current)->unknown_field_number = (int)__buf._M_original_len;
                (iVar5._M_current)->unknown_field_type = __buf._M_original_len._4_4_;
                ppSVar1 = &(parent_field->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
                uVar10 = (*(code *)(&DAT_00355dc8 + *(int *)(&DAT_00355dc8 + uVar14 * 4)))();
                return (bool)uVar10;
              }
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
              ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                        ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                          *)parent_field,iVar5,(SpecificField *)auStack_80);
              uVar10 = (*(code *)(&DAT_00355dc8 + *(int *)(&DAT_00355dc8 + uVar14 * 4)))();
              return (bool)uVar10;
            }
LAB_00325a2f:
            if (auStack_a8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_a8);
            }
            if (auStack_c8 == (undefined1  [8])0x0) {
              return bVar9;
            }
            operator_delete((void *)auStack_c8);
            return bVar9;
          }
          iVar12 = iVar12 + 1;
          iVar17 = iVar17 + 1;
          goto LAB_0032555c;
        }
LAB_003255fe:
        if (*(int *)&fields2.
                     super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[6].field_0x4 != 1) {
          pUVar24 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_a8 + uVar22 * 0x10))->second;
          uVar14 = 0;
          goto LAB_0032571b;
        }
        iVar17 = iVar17 + 1;
      } while( true );
    }
  }
  return true;
}

Assistant:

bool MessageDifferencer::CompareUnknownFields(
    const Message& message1, const Message& message2,
    const UnknownFieldSet& unknown_field_set1,
    const UnknownFieldSet& unknown_field_set2,
    std::vector<SpecificField>* parent_field) {
  // Ignore unknown fields in EQUIVALENT mode.
  if (message_field_comparison_ == EQUIVALENT) return true;

  if (unknown_field_set1.empty() && unknown_field_set2.empty()) {
    return true;
  }

  bool is_different = false;

  // We first sort the unknown fields by field number and type (in other words,
  // in tag order), making sure to preserve ordering of values with the same
  // tag.  This allows us to report only meaningful differences between the
  // two sets -- that is, differing values for the same tag.  We use
  // IndexUnknownFieldPairs to keep track of the field's original index for
  // reporting purposes.
  std::vector<IndexUnknownFieldPair> fields1;  // unknown_field_set1, sorted
  std::vector<IndexUnknownFieldPair> fields2;  // unknown_field_set2, sorted
  fields1.reserve(unknown_field_set1.field_count());
  fields2.reserve(unknown_field_set2.field_count());

  for (int i = 0; i < unknown_field_set1.field_count(); i++) {
    fields1.push_back(std::make_pair(i, &unknown_field_set1.field(i)));
  }
  for (int i = 0; i < unknown_field_set2.field_count(); i++) {
    fields2.push_back(std::make_pair(i, &unknown_field_set2.field(i)));
  }

  UnknownFieldOrdering is_before;
  std::stable_sort(fields1.begin(), fields1.end(), is_before);
  std::stable_sort(fields2.begin(), fields2.end(), is_before);

  // In order to fill in SpecificField::index, we have to keep track of how
  // many values we've seen with the same field number and type.
  // current_repeated points at the first field in this range, and
  // current_repeated_start{1,2} are the indexes of the first field in the
  // range within fields1 and fields2.
  const UnknownField* current_repeated = NULL;
  int current_repeated_start1 = 0;
  int current_repeated_start2 = 0;

  // Now that we have two sorted lists, we can detect fields which appear only
  // in one list or the other by traversing them simultaneously.
  int index1 = 0;
  int index2 = 0;
  while (index1 < fields1.size() || index2 < fields2.size()) {
    enum {
      ADDITION,
      DELETION,
      MODIFICATION,
      COMPARE_GROUPS,
      NO_CHANGE
    } change_type;

    // focus_field is the field we're currently reporting on.  (In the case
    // of a modification, it's the field on the left side.)
    const UnknownField* focus_field;
    bool match = false;

    if (index2 == fields2.size() ||
        (index1 < fields1.size() &&
         is_before(fields1[index1], fields2[index2]))) {
      // fields1[index1] is not present in fields2.
      change_type = DELETION;
      focus_field = fields1[index1].second;
    } else if (index1 == fields1.size() ||
               is_before(fields2[index2], fields1[index1])) {
      // fields2[index2] is not present in fields1.
      if (scope_ == PARTIAL) {
        // Ignore.
        ++index2;
        continue;
      }
      change_type = ADDITION;
      focus_field = fields2[index2].second;
    } else {
      // Field type and number are the same.  See if the values differ.
      change_type = MODIFICATION;
      focus_field = fields1[index1].second;

      switch (focus_field->type()) {
        case UnknownField::TYPE_VARINT:
          match = fields1[index1].second->varint() ==
                  fields2[index2].second->varint();
          break;
        case UnknownField::TYPE_FIXED32:
          match = fields1[index1].second->fixed32() ==
                  fields2[index2].second->fixed32();
          break;
        case UnknownField::TYPE_FIXED64:
          match = fields1[index1].second->fixed64() ==
                  fields2[index2].second->fixed64();
          break;
        case UnknownField::TYPE_LENGTH_DELIMITED:
          match = fields1[index1].second->length_delimited() ==
                  fields2[index2].second->length_delimited();
          break;
        case UnknownField::TYPE_GROUP:
          // We must deal with this later, after building the SpecificField.
          change_type = COMPARE_GROUPS;
          break;
      }
      if (match && change_type != COMPARE_GROUPS) {
        change_type = NO_CHANGE;
      }
    }

    if (current_repeated == NULL ||
        focus_field->number() != current_repeated->number() ||
        focus_field->type() != current_repeated->type()) {
      // We've started a new repeated field.
      current_repeated = focus_field;
      current_repeated_start1 = index1;
      current_repeated_start2 = index2;
    }

    if (change_type == NO_CHANGE && reporter_ == NULL) {
      // Fields were already compared and matched and we have no reporter.
      ++index1;
      ++index2;
      continue;
    }

    // Build the SpecificField.  This is slightly complicated.
    SpecificField specific_field;
    specific_field.unknown_field_number = focus_field->number();
    specific_field.unknown_field_type = focus_field->type();

    specific_field.unknown_field_set1 = &unknown_field_set1;
    specific_field.unknown_field_set2 = &unknown_field_set2;

    if (change_type != ADDITION) {
      specific_field.unknown_field_index1 = fields1[index1].first;
    }
    if (change_type != DELETION) {
      specific_field.unknown_field_index2 = fields2[index2].first;
    }

    // Calculate the field index.
    if (change_type == ADDITION) {
      specific_field.index = index2 - current_repeated_start2;
      specific_field.new_index = index2 - current_repeated_start2;
    } else {
      specific_field.index = index1 - current_repeated_start1;
      specific_field.new_index = index2 - current_repeated_start2;
    }

    if (IsUnknownFieldIgnored(message1, message2, specific_field,
                              *parent_field)) {
      if (reporter_ != NULL) {
        parent_field->push_back(specific_field);
        reporter_->ReportUnknownFieldIgnored(message1, message2, *parent_field);
        parent_field->pop_back();
      }
      return true;
    }

    if (change_type == ADDITION || change_type == DELETION ||
        change_type == MODIFICATION) {
      if (reporter_ == NULL) {
        // We found a difference and we have no reporter.
        return false;
      }
      is_different = true;
    }

    parent_field->push_back(specific_field);

    switch (change_type) {
      case ADDITION:
        reporter_->ReportAdded(message1, message2, *parent_field);
        ++index2;
        break;
      case DELETION:
        reporter_->ReportDeleted(message1, message2, *parent_field);
        ++index1;
        break;
      case MODIFICATION:
        reporter_->ReportModified(message1, message2, *parent_field);
        ++index1;
        ++index2;
        break;
      case COMPARE_GROUPS:
        if (!CompareUnknownFields(
                message1, message2, fields1[index1].second->group(),
                fields2[index2].second->group(), parent_field)) {
          if (reporter_ == NULL) return false;
          is_different = true;
          reporter_->ReportModified(message1, message2, *parent_field);
        }
        ++index1;
        ++index2;
        break;
      case NO_CHANGE:
        ++index1;
        ++index2;
        if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_field);
        }
    }

    parent_field->pop_back();
  }

  return !is_different;
}